

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void hmac_final(ptls_hash_context_t *_ctx,void *md,ptls_hash_final_mode_t mode)

{
  ptls_hash_final_mode_t in_EDX;
  void *in_RSI;
  st_picotls_hmac_context_t *in_RDI;
  st_picotls_hmac_context_t *ctx;
  undefined4 in_stack_ffffffffffffffdc;
  
  if (in_EDX == PTLS_HASH_FINAL_MODE_SNAPSHOT) {
    __assert_fail("mode != PTLS_HASH_FINAL_MODE_SNAPSHOT || !\"not supported\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x13c4,"void hmac_final(ptls_hash_context_t *, void *, ptls_hash_final_mode_t)");
  }
  if (in_RSI != (void *)0x0) {
    (*in_RDI->hash->final)(in_RDI->hash,in_RSI,PTLS_HASH_FINAL_MODE_RESET);
    hmac_apply_key(in_RDI,(uint8_t)((uint)in_stack_ffffffffffffffdc >> 0x18));
    (*in_RDI->hash->update)(in_RDI->hash,in_RSI,in_RDI->algo->digest_size);
  }
  (*in_RDI->hash->final)(in_RDI->hash,in_RSI,in_EDX);
  if (in_EDX == PTLS_HASH_FINAL_MODE_FREE) {
    (*ptls_clear_memory)(in_RDI->key,in_RDI->algo->block_size);
    free(in_RDI);
  }
  else {
    if (in_EDX != PTLS_HASH_FINAL_MODE_RESET) {
      __assert_fail("!\"FIXME\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0x13d6,"void hmac_final(ptls_hash_context_t *, void *, ptls_hash_final_mode_t)"
                   );
    }
    hmac_apply_key(in_RDI,'\0');
  }
  return;
}

Assistant:

static void hmac_final(ptls_hash_context_t *_ctx, void *md, ptls_hash_final_mode_t mode)
{
    struct st_picotls_hmac_context_t *ctx = (struct st_picotls_hmac_context_t *)_ctx;

    assert(mode != PTLS_HASH_FINAL_MODE_SNAPSHOT || !"not supported");

    if (md != NULL) {
        ctx->hash->final(ctx->hash, md, PTLS_HASH_FINAL_MODE_RESET);
        hmac_apply_key(ctx, 0x5c);
        ctx->hash->update(ctx->hash, md, ctx->algo->digest_size);
    }
    ctx->hash->final(ctx->hash, md, mode);

    switch (mode) {
    case PTLS_HASH_FINAL_MODE_FREE:
        ptls_clear_memory(ctx->key, ctx->algo->block_size);
        free(ctx);
        break;
    case PTLS_HASH_FINAL_MODE_RESET:
        hmac_apply_key(ctx, 0x36);
        break;
    default:
        assert(!"FIXME");
        break;
    }
}